

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3IntFloatCompare(i64 i,double r)

{
  int iVar1;
  long in_RDI;
  double in_XMM0_Qa;
  i64 y;
  undefined4 local_24;
  undefined4 local_4;
  
  iVar1 = sqlite3IsNaN(in_XMM0_Qa);
  if (iVar1 == 0) {
    if (-9.223372036854776e+18 <= in_XMM0_Qa) {
      if (in_XMM0_Qa < 9.223372036854776e+18) {
        if (in_RDI < (long)in_XMM0_Qa) {
          local_4 = 0xffffffff;
        }
        else if ((long)in_XMM0_Qa < in_RDI) {
          local_4 = 1;
        }
        else {
          if (in_XMM0_Qa <= (double)in_RDI) {
            local_24 = (uint)(in_XMM0_Qa < (double)in_RDI);
          }
          else {
            local_24 = 0xffffffff;
          }
          local_4 = local_24;
        }
      }
      else {
        local_4 = 0xffffffff;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3IntFloatCompare(i64 i, double r){
  if( sqlite3IsNaN(r) ){
    /* SQLite considers NaN to be a NULL. And all integer values are greater
    ** than NULL */
    return 1;
  }else{
    i64 y;
    if( r<-9223372036854775808.0 ) return +1;
    if( r>=9223372036854775808.0 ) return -1;
    y = (i64)r;
    if( i<y ) return -1;
    if( i>y ) return +1;
    testcase( doubleLt(((double)i),r) );
    testcase( doubleLt(r,((double)i)) );
    testcase( doubleEq(r,((double)i)) );
    return (((double)i)<r) ? -1 : (((double)i)>r);
  }
}